

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_sync.cpp
# Opt level: O0

bool __thiscall
bidfx_public_api::price::pixie::PriceSync::operator==(PriceSync *this,PriceSync *that)

{
  bool local_29;
  bool local_19;
  PriceSync *that_local;
  PriceSync *this_local;
  
  local_19 = true;
  if (this != that) {
    local_29 = false;
    if ((((this->conflation_latency_ == that->conflation_latency_) &&
         (local_29 = false, this->edition_ == that->edition_)) &&
        (local_29 = false, this->revision_ == that->revision_)) &&
       ((local_29 = false, this->revision_time_ == that->revision_time_ &&
        (local_29 = false, this->size_ == that->size_)))) {
      local_29 = tools::ByteBuffer::operator==
                           (this->price_updates_buffer_,that->price_updates_buffer_);
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

bool PriceSync::operator==(const PriceSync& that) const
    {
        return this == &that ||
            (conflation_latency_ == that.conflation_latency_ &&
            edition_ == that.edition_ &&
            revision_ == that.revision_ &&
            revision_time_ == that.revision_time_ &&
            size_ == that.size_ &&
            price_updates_buffer_ == that.price_updates_buffer_);
    }